

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::StreamArchive::decode_payload_deflate
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  uint8_t *ptr;
  size_t sVar4;
  mz_ulong mVar5;
  bool bVar6;
  ulong __size;
  mutex *__mutex;
  mz_uint8 *pmVar7;
  mz_ulong zsize;
  size_t local_38;
  
  if ((entry->header).uncompressed_size != blob_size) {
    return false;
  }
  __mutex = &this->read_lock;
  if (concurrent) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    ptr = (uint8_t *)operator_new__((ulong)(entry->header).payload_size);
    pmVar7 = ptr;
  }
  else {
    ptr = this->zlib_buffer;
    __size = (ulong)(entry->header).payload_size;
    if (this->zlib_buffer_size < __size) {
      ptr = (uint8_t *)realloc(ptr,__size);
      if (ptr == (uint8_t *)0x0) {
        free(this->zlib_buffer);
        this->zlib_buffer = (uint8_t *)0x0;
        this->zlib_buffer_size = 0;
        return false;
      }
      this->zlib_buffer = ptr;
      this->zlib_buffer_size = (ulong)(entry->header).payload_size;
    }
    pmVar7 = (mz_uint8 *)0x0;
  }
  iVar2 = fseek((FILE *)this->file,entry->offset,0);
  if (iVar2 < 0) {
    if (concurrent) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
LAB_0014294a:
    bVar6 = false;
    goto LAB_001429f7;
  }
  sVar4 = fread(ptr,1,(ulong)(entry->header).payload_size,(FILE *)this->file);
  mVar5 = (mz_ulong)(entry->header).payload_size;
  if (concurrent) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (sVar4 == mVar5) {
      mVar5 = (mz_ulong)(entry->header).payload_size;
LAB_0014295a:
      if ((entry->header).crc != 0) {
        mVar5 = mz_crc32(0,ptr,mVar5);
        if ((entry->header).crc != (uint32_t)mVar5) {
          LVar3 = get_thread_log_level();
          if ((int)LVar3 < 3) {
            bVar6 = false;
            bVar1 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n");
            if (bVar1) goto LAB_001429f7;
            decode_payload_deflate();
            goto LAB_0014294a;
          }
          goto LAB_001429f0;
        }
        mVar5 = (mz_ulong)(entry->header).payload_size;
      }
      local_38 = blob_size;
      iVar2 = mz_uncompress((uchar *)blob,&local_38,ptr,mVar5);
      bVar6 = local_38 == blob_size && iVar2 == 0;
      goto LAB_001429f7;
    }
  }
  else if (sVar4 == mVar5) goto LAB_0014295a;
LAB_001429f0:
  bVar6 = false;
LAB_001429f7:
  if (pmVar7 != (mz_uint8 *)0x0) {
    operator_delete__(pmVar7);
  }
  return bVar6;
}

Assistant:

bool decode_payload_deflate(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size)
			return false;

		uint8_t *dst_zlib_buffer = nullptr;
		std::unique_ptr<uint8_t[]> zlib_buffer_holder;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (concurrent)
			{
				dst_zlib_buffer = new uint8_t[entry.header.payload_size];
				zlib_buffer_holder.reset(dst_zlib_buffer);
			}
			else if (zlib_buffer_size < entry.header.payload_size)
			{
				auto *new_zlib_buffer = static_cast<uint8_t *>(realloc(zlib_buffer, entry.header.payload_size));
				if (new_zlib_buffer)
				{
					zlib_buffer = new_zlib_buffer;
					zlib_buffer_size = entry.header.payload_size;
				}
				else
				{
					free(zlib_buffer);
					zlib_buffer = nullptr;
					zlib_buffer_size = 0;
				}

				if (!zlib_buffer)
					return false;

				dst_zlib_buffer = zlib_buffer;
			}
			else
				dst_zlib_buffer = zlib_buffer;

			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;
			if (fread(dst_zlib_buffer, 1, entry.header.payload_size, file) != entry.header.payload_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, dst_zlib_buffer, entry.header.payload_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		mz_ulong zsize = blob_size;
		if (mz_uncompress(static_cast<unsigned char *>(blob), &zsize, dst_zlib_buffer, entry.header.payload_size) != MZ_OK)
			return false;
		if (zsize != blob_size)
			return false;

		return true;
	}